

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_logging.cc
# Opt level: O0

void absl::raw_logging_internal::AsyncSignalSafeWriteToStderr(char *s,size_t len)

{
  ErrnoSaver local_1c;
  size_t sStack_18;
  ErrnoSaver errno_saver;
  size_t len_local;
  char *s_local;
  
  sStack_18 = len;
  base_internal::ErrnoSaver::ErrnoSaver(&local_1c);
  syscall(1,2,s,sStack_18);
  base_internal::ErrnoSaver::~ErrnoSaver(&local_1c);
  return;
}

Assistant:

void AsyncSignalSafeWriteToStderr(const char* s, size_t len) {
  absl::base_internal::ErrnoSaver errno_saver;
#if defined(ABSL_HAVE_SYSCALL_WRITE)
  // We prefer calling write via `syscall` to minimize the risk of libc doing
  // something "helpful".
  syscall(SYS_write, STDERR_FILENO, s, len);
#elif defined(ABSL_HAVE_POSIX_WRITE)
  write(STDERR_FILENO, s, len);
#elif defined(ABSL_HAVE_RAW_IO)
  _write(/* stderr */ 2, s, len);
#else
  // stderr logging unsupported on this platform
  (void) s;
  (void) len;
#endif
}